

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_sse_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  uint16_t buffer [8];
  
  if ((len & 0x7f) != 0) {
    uVar1 = (ulong)(len & 0xffffff80);
    auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar17 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar19 = vpbroadcastd_avx512f();
      auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
      auVar19 = vpandd_avx512f(auVar19,auVar18);
      auVar16 = vpaddd_avx512f(auVar19,auVar16);
      uVar1 = uVar1 + 1;
    } while (uVar1 < len);
    auVar16 = vmovdqu64_avx512f(auVar16);
    *(undefined1 (*) [64])flags = auVar16;
  }
  uVar5 = len >> 3 & 0xfffffff0;
  uVar1 = (ulong)uVar5;
  if (uVar5 == 0) {
    auVar20 = (undefined1  [16])0x0;
    auVar22 = (undefined1  [16])0x0;
    auVar21 = (undefined1  [16])0x0;
    auVar23 = (undefined1  [16])0x0;
  }
  else {
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    uVar2 = 0;
    auVar20._8_2_ = 0x5555;
    auVar20._0_8_ = 0x5555555555555555;
    auVar20._10_2_ = 0x5555;
    auVar20._12_2_ = 0x5555;
    auVar20._14_2_ = 0x5555;
    auVar21._8_2_ = 0x3333;
    auVar21._0_8_ = 0x3333333333333333;
    auVar21._10_2_ = 0x3333;
    auVar21._12_2_ = 0x3333;
    auVar21._14_2_ = 0x3333;
    auVar22._8_2_ = 0x707;
    auVar22._0_8_ = 0x707070707070707;
    auVar22._10_2_ = 0x707;
    auVar22._12_2_ = 0x707;
    auVar22._14_2_ = 0x707;
    auVar23._8_4_ = 0xf;
    auVar23._0_8_ = 0xf0000000f;
    auVar23._12_4_ = 0xf;
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar10 = auVar18._0_16_;
      auVar9 = auVar19._0_16_;
      auVar7 = auVar24._0_16_;
      auVar8 = auVar26._0_16_;
      uVar4 = uVar2 + 0xffff;
      if (uVar1 - uVar2 < 0x10000) {
        uVar4 = uVar1;
      }
      if (uVar2 < uVar4) {
        pauVar6 = (undefined1 (*) [16])(array + uVar2 * 8 + 0x78);
        do {
          auVar7 = vmovdqu64_avx512vl(pauVar6[-0xc]);
          auVar8 = vpxorq_avx512vl(pauVar6[-0xf],auVar27._0_16_);
          auVar9 = vpandq_avx512vl(auVar8,pauVar6[-0xe]);
          auVar9 = vpternlogq_avx512vl(auVar9,pauVar6[-0xf],auVar27._0_16_,0xf8);
          auVar10 = vpxorq_avx512vl(auVar8,pauVar6[-0xe]);
          auVar8 = auVar10 ^ pauVar6[-0xd];
          auVar11 = vpandq_avx512vl(auVar8,auVar7);
          auVar10 = vpternlogq_avx512vl(auVar11,auVar10,pauVar6[-0xd],0xf8);
          auVar7 = vpxorq_avx512vl(auVar8,auVar7);
          auVar11 = vpxorq_avx512vl(auVar9,auVar25._0_16_);
          auVar8 = vpand_avx(auVar10,auVar11);
          auVar8 = vpternlogq_avx512vl(auVar8,auVar9,auVar25._0_16_,0xf8);
          auVar9 = vpxorq_avx512vl(auVar7,pauVar6[-0xb]);
          auVar12 = vpandq_avx512vl(auVar9,pauVar6[-10]);
          auVar7 = vpternlogq_avx512vl(auVar12,auVar7,pauVar6[-0xb],0xf8);
          auVar9 = vpxorq_avx512vl(auVar9,pauVar6[-10]);
          auVar12 = vpxorq_avx512vl(auVar9,pauVar6[-9]);
          auVar13 = vpandq_avx512vl(auVar12,pauVar6[-8]);
          auVar9 = vpternlogq_avx512vl(auVar13,auVar9,pauVar6[-9],0xf8);
          auVar12 = vpxorq_avx512vl(auVar12,pauVar6[-8]);
          auVar13 = vpxorq_avx512vl(auVar7,auVar10 ^ auVar11);
          auVar14 = vpandq_avx512vl(auVar9,auVar13);
          auVar7 = vpternlogq_avx512vl(auVar14,auVar7,auVar10 ^ auVar11,0xf8);
          auVar9 = vpxorq_avx512vl(auVar9,auVar13);
          auVar10 = vpxorq_avx512vl(auVar8,auVar17._0_16_);
          auVar11 = vpandq_avx512vl(auVar7,auVar10);
          auVar13 = vpternlogq_avx512vl(auVar11,auVar8,auVar17._0_16_,0xf8);
          auVar11 = vpxorq_avx512vl(auVar7,auVar10);
          auVar8 = vpxorq_avx512vl(auVar12,pauVar6[-7]);
          auVar7 = vpandq_avx512vl(auVar8,pauVar6[-6]);
          auVar7 = vpternlogq_avx512vl(auVar7,auVar12,pauVar6[-7],0xf8);
          auVar8 = vpxorq_avx512vl(auVar8,pauVar6[-6]);
          auVar10 = vpxorq_avx512vl(auVar8,pauVar6[-5]);
          auVar12 = vpandq_avx512vl(auVar10,pauVar6[-4]);
          auVar8 = vpternlogq_avx512vl(auVar12,auVar8,pauVar6[-5],0xf8);
          auVar10 = vpxorq_avx512vl(auVar10,pauVar6[-4]);
          auVar12 = vpxorq_avx512vl(auVar7,auVar9);
          auVar14 = vpandq_avx512vl(auVar8,auVar12);
          auVar9 = vpternlogq_avx512vl(auVar14,auVar7,auVar9,0xf8);
          auVar8 = vpxorq_avx512vl(auVar8,auVar12);
          auVar7 = vmovdqu64_avx512vl(pauVar6[-2]);
          auVar12 = vpxorq_avx512vl(auVar10,pauVar6[-3]);
          auVar14 = vpandq_avx512vl(auVar12,auVar7);
          auVar10 = vpternlogq_avx512vl(auVar14,auVar10,pauVar6[-3],0xf8);
          auVar7 = vpxorq_avx512vl(auVar12,auVar7);
          auVar12 = vmovdqu64_avx512vl(*pauVar6);
          auVar14 = vpxorq_avx512vl(auVar7,pauVar6[-1]);
          auVar15 = vpandq_avx512vl(auVar14,auVar12);
          auVar7 = vpternlogq_avx512vl(auVar15,auVar7,pauVar6[-1],0xf8);
          auVar12 = vpxorq_avx512vl(auVar14,auVar12);
          auVar27 = ZEXT1664(auVar12);
          auVar12 = vpxorq_avx512vl(auVar10,auVar8);
          auVar14 = vpandq_avx512vl(auVar7,auVar12);
          auVar14 = vpternlogq_avx512vl(auVar14,auVar10,auVar8,0xf8);
          auVar8 = vpxorq_avx512vl(auVar7,auVar12);
          auVar25 = ZEXT1664(auVar8);
          auVar8 = vpandq_avx512vl(auVar14,auVar9 ^ auVar11);
          auVar12 = vpternlogq_avx512vl(auVar8,auVar9,auVar11,0xf8);
          auVar7 = vpsrld_avx(auVar28._0_16_,1);
          auVar8 = vpand_avx(auVar28._0_16_,auVar20);
          auVar7 = vpand_avx(auVar7,auVar20);
          auVar8 = vphaddw_avx(auVar8,auVar7);
          auVar7 = vpsrld_avx(auVar8,2);
          auVar8 = vpand_avx(auVar8,auVar21);
          auVar7 = vpand_avx(auVar7,auVar21);
          auVar8 = vphaddw_avx(auVar8,auVar7);
          auVar7 = vpsrld_avx(auVar8,4);
          auVar8 = vpand_avx(auVar8,auVar22);
          auVar7 = vpand_avx(auVar7,auVar22);
          auVar10 = vphaddw_avx(auVar8,auVar7);
          auVar8 = vpxorq_avx512vl(auVar14,auVar9 ^ auVar11);
          auVar17 = ZEXT1664(auVar8);
          auVar8 = vpand_avx(auVar10,auVar23);
          auVar8 = vpaddd_avx(auVar8,auVar26._0_16_);
          auVar26 = ZEXT1664(auVar8);
          auVar7 = vpsrld_avx(auVar10,8);
          auVar7 = vpand_avx(auVar7,auVar23);
          auVar7 = vpaddd_avx(auVar24._0_16_,auVar7);
          auVar24 = ZEXT1664(auVar7);
          auVar9 = vpsrld_avx(auVar10,0x10);
          auVar9 = vpand_avx(auVar9,auVar23);
          auVar9 = vpaddd_avx(auVar9,auVar19._0_16_);
          auVar19 = ZEXT1664(auVar9);
          auVar10 = vpsrld_avx(auVar10,0x18);
          auVar10 = vpaddd_avx(auVar10,auVar18._0_16_);
          auVar18 = ZEXT1664(auVar10);
          auVar11 = auVar13 ^ auVar16._0_16_;
          auVar14 = vpandq_avx512vl(auVar12,auVar11);
          auVar13 = vpternlogq_avx512vl(auVar14,auVar13,auVar16._0_16_,0xf8);
          auVar28 = ZEXT1664(auVar13);
          auVar11 = vpxorq_avx512vl(auVar12,auVar11);
          auVar16 = ZEXT1664(auVar11);
          uVar2 = uVar2 + 0x10;
          pauVar6 = pauVar6 + 0x10;
        } while (uVar2 < uVar4);
      }
      auVar12 = vpsrld_avx(auVar28._0_16_,1);
      auVar11 = vpand_avx(auVar28._0_16_,auVar20);
      auVar12 = vpand_avx(auVar12,auVar20);
      auVar11 = vphaddw_avx(auVar11,auVar12);
      auVar12 = vpsrld_avx(auVar11,2);
      auVar11 = vpand_avx(auVar11,auVar21);
      auVar12 = vpand_avx(auVar12,auVar21);
      auVar11 = vphaddw_avx(auVar11,auVar12);
      auVar12 = vpsrld_avx(auVar11,4);
      auVar11 = vpand_avx(auVar11,auVar22);
      auVar12 = vpand_avx(auVar12,auVar22);
      auVar12 = vphaddw_avx(auVar11,auVar12);
      auVar11 = vpand_avx(auVar12,auVar23);
      auVar8 = vpaddd_avx(auVar11,auVar8);
      auVar26 = ZEXT1664(auVar8);
      auVar11 = vpsrld_avx(auVar12,8);
      auVar11 = vpand_avx(auVar11,auVar23);
      auVar7 = vpaddd_avx(auVar7,auVar11);
      auVar24 = ZEXT1664(auVar7);
      auVar11 = vpsrld_avx(auVar12,0x10);
      auVar11 = vpand_avx(auVar11,auVar23);
      auVar9 = vpaddd_avx(auVar11,auVar9);
      auVar19 = ZEXT1664(auVar9);
      auVar11 = vpsrld_avx(auVar12,0x18);
      auVar10 = vpaddd_avx(auVar11,auVar10);
      auVar18 = ZEXT1664(auVar10);
    } while (uVar2 < uVar1);
    auVar23 = vpslld_avx(auVar8,4);
    auVar21 = vpslld_avx(auVar7,4);
    auVar22 = vpslld_avx(auVar9,4);
    auVar20 = vpslld_avx(auVar10,4);
  }
  auVar8 = vpunpckldq_avx(auVar23,auVar22);
  auVar8 = vpaddd_avx(auVar8,*(undefined1 (*) [16])flags);
  *(undefined1 (*) [16])flags = auVar8;
  auVar22 = vpunpckhdq_avx(auVar23,auVar22);
  auVar22 = vpaddd_avx(auVar22,*(undefined1 (*) [16])(flags + 4));
  *(undefined1 (*) [16])(flags + 4) = auVar22;
  auVar22 = vpunpckldq_avx(auVar21,auVar20);
  auVar22 = vpaddd_avx(auVar22,*(undefined1 (*) [16])(flags + 8));
  *(undefined1 (*) [16])(flags + 8) = auVar22;
  auVar20 = vpunpckhdq_avx(auVar21,auVar20);
  auVar20 = vpaddd_avx(auVar20,*(undefined1 (*) [16])(flags + 0xc));
  *(undefined1 (*) [16])(flags + 0xc) = auVar20;
  auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar17 = vpmovsxbd_avx512f(_DAT_00116080);
  auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
  do {
    auVar19 = vpbroadcastd_avx512f();
    auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
    auVar19 = vpandd_avx512f(auVar19,auVar18);
    auVar16 = vpaddd_avx512f(auVar19,auVar16);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  auVar16 = vmovdqu64_avx512f(auVar16);
  *(undefined1 (*) [64])flags = auVar16;
  auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar18 = vpbroadcastd_avx512f(ZEXT416(2));
  do {
    auVar19 = vpbroadcastd_avx512f();
    auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
    auVar19 = vpaddd_avx512f(auVar19,auVar19);
    auVar19 = vpandd_avx512f(auVar19,auVar18);
    auVar16 = vpaddd_avx512f(auVar19,auVar16);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  auVar16 = vmovdqu64_avx512f(auVar16);
  *(undefined1 (*) [64])flags = auVar16;
  auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar18 = vpbroadcastd_avx512f(ZEXT416(4));
  do {
    auVar19 = vpbroadcastd_avx512f();
    auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
    auVar19 = vpslld_avx512f(auVar19,2);
    auVar19 = vpandd_avx512f(auVar19,auVar18);
    auVar16 = vpaddd_avx512f(auVar19,auVar16);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  auVar16 = vmovdqu64_avx512f(auVar16);
  *(undefined1 (*) [64])flags = auVar16;
  auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar18 = vpbroadcastd_avx512f(ZEXT416(8));
  do {
    auVar19 = vpbroadcastd_avx512f();
    auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
    auVar19 = vpslld_avx512f(auVar19,3);
    auVar19 = vpandd_avx512f(auVar19,auVar18);
    auVar16 = vpaddd_avx512f(auVar19,auVar16);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  auVar16 = vmovdqu64_avx512f(auVar16);
  *(undefined1 (*) [64])flags = auVar16;
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm_setzero_si128();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m128i output; \
        { \
            const __m128i tmp0 = _mm_and_si128(input, mask); \
            const __m128i tmp1 = _mm_and_si128(_mm_srli_epi32(input, shift), mask); \
            output = _mm_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
                counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_sse(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2);

            const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
            counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm_slli_epi32(counter[3], 4); // * 16

#if 0 // Left to illustrate the mapping between auxiliary counters and flags.
    flags[0] += _mm_extract_epi32(counter[0], 0);
    flags[1] += _mm_extract_epi32(counter[2], 0);
    flags[2] += _mm_extract_epi32(counter[0], 1);
    flags[3] += _mm_extract_epi32(counter[2], 1);
    flags[4] += _mm_extract_epi32(counter[0], 2);
    flags[5] += _mm_extract_epi32(counter[2], 2);
    flags[6] += _mm_extract_epi32(counter[0], 3);
    flags[7] += _mm_extract_epi32(counter[2], 3);

    flags[8]  += _mm_extract_epi32(counter[1], 0);
    flags[9]  += _mm_extract_epi32(counter[3], 0);
    flags[10] += _mm_extract_epi32(counter[1], 1);
    flags[11] += _mm_extract_epi32(counter[3], 1);
    flags[12] += _mm_extract_epi32(counter[1], 2);
    flags[13] += _mm_extract_epi32(counter[3], 2);
    flags[14] += _mm_extract_epi32(counter[1], 3);
    flags[15] += _mm_extract_epi32(counter[3], 3);
#else
#define update_flags(offset, counters)                  \
    {                                                   \
        __m128i* ptr = (__m128i*)(flags + offset);      \
        const __m128i f = _mm_loadu_si128(ptr);         \
        const __m128i s = _mm_add_epi32(f, counters);   \
        _mm_storeu_si128(ptr, s);                       \
    }
    update_flags(0  /*  0 ..  3 */, _mm_unpacklo_epi32(counter[0], counter[2]));
    update_flags(4  /*  4 ..  7 */, _mm_unpackhi_epi32(counter[0], counter[2]));
    update_flags(8  /*  8 .. 11 */, _mm_unpacklo_epi32(counter[1], counter[3]));
    update_flags(12 /* 12 .. 15 */, _mm_unpackhi_epi32(counter[1], counter[3]));
#undef update_flags
#endif

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}